

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::updateMetadata
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path,Parameters *parameters)

{
  Client *client;
  Url local_40;
  
  if (this->version_ == v2) {
    client = this->client_;
    getMetadataUrl(&local_40,this,path);
    HttpConsumer::post(__return_storage_ptr__,client,&local_40,parameters);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.value_._M_dataplus._M_p != &local_40.value_.field_2) {
      operator_delete(local_40.value_._M_dataplus._M_p,
                      local_40.value_.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::updateMetadata(const Path &path,
                                const Parameters &parameters) {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::post(client_, getMetadataUrl(path), parameters);
}